

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicOneWorkGroup::Run(BasicOneWorkGroup *this)

{
  bool bVar1;
  long lVar2;
  
  bVar1 = RunIteration(this,0x10,1,1,0,true);
  lVar2 = -1;
  if (bVar1) {
    bVar1 = RunIteration(this,8,8,1,1,false);
    if (bVar1) {
      bVar1 = RunIteration(this,4,4,4,2,true);
      if (bVar1) {
        bVar1 = RunIteration(this,1,2,3,3,false);
        if (bVar1) {
          bVar1 = RunIteration(this,0x400,1,1,3,true);
          if (bVar1) {
            bVar1 = RunIteration(this,0x10,8,8,3,false);
            if (bVar1) {
              bVar1 = RunIteration(this,0x20,1,0x20,7,true);
              lVar2 = (ulong)bVar1 - 1;
            }
          }
        }
      }
    }
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		if (!RunIteration(16, 1, 1, 0, true))
			return ERROR;
		if (!RunIteration(8, 8, 1, 1, false))
			return ERROR;
		if (!RunIteration(4, 4, 4, 2, true))
			return ERROR;
		if (!RunIteration(1, 2, 3, 3, false))
			return ERROR;
		if (!RunIteration(1024, 1, 1, 3, true))
			return ERROR;
		if (!RunIteration(16, 8, 8, 3, false))
			return ERROR;
		if (!RunIteration(32, 1, 32, 7, true))
			return ERROR;
		return NO_ERROR;
	}